

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5HashEntry * fts5HashEntryMerge(Fts5HashEntry *pLeft,Fts5HashEntry *pRight)

{
  Fts5HashEntry *pFVar1;
  Fts5HashEntry *pFVar2;
  Fts5HashEntry *pFVar3;
  char *zKey2;
  char *zKey1;
  Fts5HashEntry **ppFStack_38;
  int i;
  Fts5HashEntry **ppOut;
  Fts5HashEntry *pRet;
  Fts5HashEntry *p2;
  Fts5HashEntry *p1;
  Fts5HashEntry *pRight_local;
  Fts5HashEntry *pLeft_local;
  
  ppOut = (Fts5HashEntry **)0x0;
  ppFStack_38 = (Fts5HashEntry **)&ppOut;
  pRet = pRight;
  p2 = pLeft;
  while (p2 != (Fts5HashEntry *)0x0 || pRet != (Fts5HashEntry *)0x0) {
    if (p2 == (Fts5HashEntry *)0x0) {
      *ppFStack_38 = pRet;
      pRet = (Fts5HashEntry *)0x0;
    }
    else if (pRet == (Fts5HashEntry *)0x0) {
      *ppFStack_38 = p2;
      p2 = (Fts5HashEntry *)0x0;
    }
    else {
      for (zKey1._4_4_ = 0;
          *(char *)((long)&p2[1].pHashNext + (long)zKey1._4_4_) ==
          *(char *)((long)&pRet[1].pHashNext + (long)zKey1._4_4_); zKey1._4_4_ = zKey1._4_4_ + 1) {
      }
      if (*(byte *)((long)&pRet[1].pHashNext + (long)zKey1._4_4_) <
          *(byte *)((long)&p2[1].pHashNext + (long)zKey1._4_4_)) {
        *ppFStack_38 = pRet;
        pFVar2 = pRet->pScanNext;
        pFVar3 = p2;
        pFVar1 = pRet;
      }
      else {
        *ppFStack_38 = p2;
        pFVar2 = pRet;
        pFVar3 = p2->pScanNext;
        pFVar1 = p2;
      }
      p2 = pFVar3;
      pRet = pFVar2;
      ppFStack_38 = &pFVar1->pScanNext;
      *ppFStack_38 = (Fts5HashEntry *)0x0;
    }
  }
  return (Fts5HashEntry *)ppOut;
}

Assistant:

static Fts5HashEntry *fts5HashEntryMerge(
  Fts5HashEntry *pLeft,
  Fts5HashEntry *pRight
){
  Fts5HashEntry *p1 = pLeft;
  Fts5HashEntry *p2 = pRight;
  Fts5HashEntry *pRet = 0;
  Fts5HashEntry **ppOut = &pRet;

  while( p1 || p2 ){
    if( p1==0 ){
      *ppOut = p2;
      p2 = 0;
    }else if( p2==0 ){
      *ppOut = p1;
      p1 = 0;
    }else{
      int i = 0;
      char *zKey1 = fts5EntryKey(p1);
      char *zKey2 = fts5EntryKey(p2);
      while( zKey1[i]==zKey2[i] ) i++;

      if( ((u8)zKey1[i])>((u8)zKey2[i]) ){
        /* p2 is smaller */
        *ppOut = p2;
        ppOut = &p2->pScanNext;
        p2 = p2->pScanNext;
      }else{
        /* p1 is smaller */
        *ppOut = p1;
        ppOut = &p1->pScanNext;
        p1 = p1->pScanNext;
      }
      *ppOut = 0;
    }
  }

  return pRet;
}